

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

int Vec_IntFindMax(Vec_Int_t *p)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  if ((long)p->nSize == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = *p->pArray;
    for (lVar3 = 1; lVar3 < p->nSize; lVar3 = lVar3 + 1) {
      iVar1 = p->pArray[lVar3];
      if (iVar2 <= iVar1) {
        iVar2 = iVar1;
      }
    }
  }
  return iVar2;
}

Assistant:

static inline int Vec_IntFindMax( Vec_Int_t * p )
{
    int i, Best;
    if ( p->nSize == 0 )
        return 0;
    Best = p->pArray[0];
    for ( i = 1; i < p->nSize; i++ )
        if ( Best < p->pArray[i] )
            Best = p->pArray[i];
    return Best;
}